

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Otter.cpp
# Opt level: O1

void __thiscall Saturation::Otter::onPassiveAdded(Otter *this,Clause *cl)

{
  HandlerList *pHVar1;
  
  SaturationAlgorithm::onPassiveAdded(&this->super_SaturationAlgorithm,cl);
  pHVar1 = (this->_simplCont).super_ClauseContainer.addedEvent.super_BaseEvent._handlers;
  if (pHVar1 != (HandlerList *)0x0 && (cl->field_0x3b & 0xe) == 0) {
    do {
      (*pHVar1->_head->_vptr_HandlerStruct[2])(pHVar1->_head,cl);
      pHVar1 = pHVar1->_tail;
    } while (pHVar1 != (List<Lib::BaseEvent::HandlerStruct_*> *)0x0);
  }
  return;
}

Assistant:

void Otter::onPassiveAdded(Clause* cl)
{
  SaturationAlgorithm::onPassiveAdded(cl);

  if(cl->store()==Clause::PASSIVE) {
    _simplCont.add(cl);
  }
}